

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O0

void __thiscall
gvr::TexturedMesh::savePLY(TexturedMesh *this,char *plyname,bool all,ply_encoding enc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  int in_ECX;
  size_t sVar6;
  byte in_DL;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  char *in_RSI;
  string *psVar7;
  TexturedMesh *in_RDI;
  int i_1;
  int i;
  ostringstream out;
  PLYWriter ply;
  float in_stack_fffffffffffff840;
  float in_stack_fffffffffffff844;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  string *in_stack_fffffffffffff888;
  allocator *paVar8;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  ply_type in_stack_fffffffffffff900;
  ply_type in_stack_fffffffffffff904;
  ply_type tvalue;
  string *in_stack_fffffffffffff908;
  allocator *name;
  PLYWriter *in_stack_fffffffffffff910;
  PLYWriter *this_00;
  int local_6b4;
  uint local_6b0;
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [16];
  PLYWriter *in_stack_fffffffffffffbe8;
  Model *in_stack_fffffffffffffbf0;
  string local_408 [32];
  ostringstream local_3e8 [392];
  PLYWriter local_260;
  int local_18;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_18 = in_ECX;
  local_10 = in_RSI;
  PLYWriter::PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  PLYWriter::open(&local_260,local_10,local_18);
  Model::setOriginToPLY(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::__cxx11::ostringstream::ostringstream(local_3e8);
  poVar5 = std::operator<<((ostream *)local_3e8,"TextureFile ");
  std::operator<<(poVar5,(string *)&in_RDI->name);
  std::__cxx11::ostringstream::str();
  PLYWriter::addComment
            ((PLYWriter *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"vertex",&local_429);
  PointCloud::getVertexCount((PointCloud *)in_RDI);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             in_stack_fffffffffffff888,CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880)
            );
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"x",&local_451);
  PLYWriter::addProperty
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff904);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  this_00 = (PLYWriter *)&local_479;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"y",(allocator *)this_00);
  PLYWriter::addProperty(this_00,in_stack_fffffffffffff908,in_stack_fffffffffffff904);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  name = &local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"z",name);
  PLYWriter::addProperty(this_00,(string *)name,in_stack_fffffffffffff904);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  bVar1 = PointCloud::hasScanProp((PointCloud *)in_RDI);
  tvalue = CONCAT13(bVar1,(int3)in_stack_fffffffffffff904);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"scan_size",&local_4c9);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    if ((local_11 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f0,"scan_error",&local_4f1);
      PLYWriter::addProperty(this_00,(string *)name,tvalue);
      std::__cxx11::string::~string(local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"scan_conf",&local_519);
      PLYWriter::addProperty(this_00,(string *)name,tvalue);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
    }
  }
  if (((local_11 & 1) != 0) && (bVar1 = PointCloud::hasScanPos((PointCloud *)in_RDI), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"sx",&local_541);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"sy",&local_569);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_590,"sz",&local_591);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
  }
  if ((local_11 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"nx",&local_5b9);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"ny",&local_5e1);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_608,"nz",&local_609);
    PLYWriter::addProperty(this_00,(string *)name,tvalue);
    std::__cxx11::string::~string(local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"u",&local_631);
  PLYWriter::addProperty(this_00,(string *)name,tvalue);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"v",&local_659);
  PLYWriter::addProperty(this_00,(string *)name,tvalue);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"face",&local_681);
  iVar2 = Mesh::getTriangleCount(&in_RDI->super_Mesh);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(iVar2,in_stack_fffffffffffff890),in_stack_fffffffffffff888,
             CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  paVar8 = &local_6a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"vertex_indices",paVar8);
  psVar7 = local_6a8;
  PLYWriter::addProperty(this_00,(string *)name,tvalue,in_stack_fffffffffffff900);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  local_6b0 = 0;
  while( true ) {
    uVar4 = local_6b0;
    uVar3 = PointCloud::getVertexCount((PointCloud *)in_RDI);
    sVar6 = (size_t)uVar3;
    if ((int)uVar3 <= (int)uVar4) break;
    uVar4 = local_6b0;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_6b0,0);
    PLYWriter::write(&local_260,uVar4,__buf,sVar6);
    uVar4 = local_6b0;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_6b0,1);
    PLYWriter::write(&local_260,uVar4,__buf_00,sVar6);
    uVar4 = local_6b0;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_6b0,2);
    PLYWriter::write(&local_260,uVar4,__buf_01,sVar6);
    bVar1 = PointCloud::hasScanProp((PointCloud *)in_RDI);
    if (bVar1) {
      uVar4 = local_6b0;
      PointCloud::getScanSize((PointCloud *)in_RDI,local_6b0);
      PLYWriter::write(&local_260,uVar4,__buf_02,sVar6);
      if ((local_11 & 1) != 0) {
        uVar4 = local_6b0;
        PointCloud::getScanError((PointCloud *)in_RDI,local_6b0);
        PLYWriter::write(&local_260,uVar4,__buf_03,sVar6);
        uVar4 = local_6b0;
        PointCloud::getScanConf((PointCloud *)in_RDI,local_6b0);
        PLYWriter::write(&local_260,uVar4,__buf_04,sVar6);
      }
    }
    if (((local_11 & 1) != 0) && (bVar1 = PointCloud::hasScanPos((PointCloud *)in_RDI), bVar1)) {
      uVar4 = local_6b0;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_6b0,0);
      PLYWriter::write(&local_260,uVar4,__buf_05,sVar6);
      uVar4 = local_6b0;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_6b0,1);
      PLYWriter::write(&local_260,uVar4,__buf_06,sVar6);
      uVar4 = local_6b0;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_6b0,2);
      PLYWriter::write(&local_260,uVar4,__buf_07,sVar6);
    }
    if ((local_11 & 1) != 0) {
      uVar4 = local_6b0;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_6b0,0);
      PLYWriter::write(&local_260,uVar4,__buf_08,sVar6);
      uVar4 = local_6b0;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_6b0,1);
      PLYWriter::write(&local_260,uVar4,__buf_09,sVar6);
      uVar4 = local_6b0;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_6b0,2);
      PLYWriter::write(&local_260,uVar4,__buf_10,sVar6);
    }
    uVar4 = local_6b0;
    in_stack_fffffffffffff844 = getTextureCoordComp(in_RDI,local_6b0,0);
    PLYWriter::write(&local_260,uVar4,__buf_11,sVar6);
    psVar7 = (string *)(ulong)local_6b0;
    in_stack_fffffffffffff840 = getTextureCoordComp(in_RDI,local_6b0,1);
    PLYWriter::write(&local_260,(int)psVar7,__buf_12,sVar6);
    local_6b0 = local_6b0 + 1;
  }
  local_6b4 = 0;
  while( true ) {
    iVar2 = (int)psVar7;
    uVar4 = Mesh::getTriangleCount(&in_RDI->super_Mesh);
    sVar6 = (size_t)uVar4;
    if ((int)uVar4 <= local_6b4) break;
    PLYWriter::writeListSize
              ((PLYWriter *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),uVar4);
    uVar4 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_6b4,0);
    PLYWriter::write(&local_260,uVar4,__buf_13,sVar6);
    uVar4 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_6b4,1);
    PLYWriter::write(&local_260,uVar4,__buf_14,sVar6);
    uVar4 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_6b4,2);
    psVar7 = (string *)(ulong)uVar4;
    PLYWriter::write(&local_260,uVar4,__buf_15,sVar6);
    local_6b4 = local_6b4 + 1;
  }
  PLYWriter::close(&local_260,iVar2);
  std::__cxx11::ostringstream::~ostringstream(local_3e8);
  PLYWriter::~PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  return;
}

Assistant:

void TexturedMesh::savePLY(const char *plyname, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(plyname, enc);

  // define data

  setOriginToPLY(ply);

  std::ostringstream out;
  out << "TextureFile " << name;
  ply.addComment(out.str());

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addProperty("u", ply_float32);
  ply.addProperty("v", ply_float32);

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }

    ply.write(getTextureCoordComp(i, 0));
    ply.write(getTextureCoordComp(i, 1));
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}